

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

int flatbuffers::FromUTF8(char **in)

{
  byte *pbVar1;
  int mask;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  pbVar1 = (byte *)*in;
  iVar3 = 0;
  for (uVar2 = 0x80; (iVar3 != -6 && ((uVar2 & *pbVar1) != 0)); uVar2 = uVar2 >> 1) {
    iVar3 = iVar3 + -1;
  }
  uVar2 = -iVar3;
  if (-1 < (char)(*pbVar1 << ((byte)uVar2 & 0x1f))) {
    if (iVar3 == 0) {
      *in = (char *)(pbVar1 + 1);
      return (int)(char)*pbVar1;
    }
    if (uVar2 < 5 && iVar3 != -1) {
      *in = (char *)(pbVar1 + 1);
      uVar4 = ~(-1 << ((char)iVar3 + 7U & 0x1f)) & (uint)*pbVar1;
      if (iVar3 == -1) {
        if (uVar2 == 4) {
          if (0xffefffff < uVar4 - 0x110000) {
            return uVar4;
          }
        }
        else if (uVar2 == 3) {
          if (0xffff07ff < uVar4 - 0x10000) {
            return uVar4;
          }
        }
        else if (0xfffff87f < uVar4 - 0x800) {
          return uVar4;
        }
      }
    }
  }
  return -1;
}

Assistant:

inline int FromUTF8(const char **in) {
  int len = 0;
  // Count leading 1 bits.
  for (int mask = 0x80; mask >= 0x04; mask >>= 1) {
    if (**in & mask) {
      len++;
    } else {
      break;
    }
  }
  if ((static_cast<unsigned char>(**in) << len) & 0x80)
    return -1;  // Bit after leading 1's must be 0.
  if (!len) return *(*in)++;
  // UTF-8 encoded values with a length are between 2 and 4 bytes.
  if (len < 2 || len > 4) { return -1; }
  // Grab initial bits of the code.
  int ucc = *(*in)++ & ((1 << (7 - len)) - 1);
  for (int i = 0; i < len - 1; i++) {
    if ((**in & 0xC0) != 0x80) return -1;  // Upper bits must 1 0.
    ucc <<= 6;
    ucc |= *(*in)++ & 0x3F;  // Grab 6 more bits of the code.
  }
  // UTF-8 cannot encode values between 0xD800 and 0xDFFF (reserved for
  // UTF-16 surrogate pairs).
  if (ucc >= 0xD800 && ucc <= 0xDFFF) { return -1; }
  // UTF-8 must represent code points in their shortest possible encoding.
  switch (len) {
    case 2:
      // Two bytes of UTF-8 can represent code points from U+0080 to U+07FF.
      if (ucc < 0x0080 || ucc > 0x07FF) { return -1; }
      break;
    case 3:
      // Three bytes of UTF-8 can represent code points from U+0800 to U+FFFF.
      if (ucc < 0x0800 || ucc > 0xFFFF) { return -1; }
      break;
    case 4:
      // Four bytes of UTF-8 can represent code points from U+10000 to U+10FFFF.
      if (ucc < 0x10000 || ucc > 0x10FFFF) { return -1; }
      break;
  }
  return ucc;
}